

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *p,Vec_Int_t *vPivot,int fRemove,int fUpdate)

{
  Vec_Int_t *pVVar1;
  Vec_Flt_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iDiv;
  int Lit2;
  int Lit;
  int n;
  int k;
  int fUpdate_local;
  int fRemove_local;
  Vec_Int_t *vPivot_local;
  Fx_Man_t *p_local;
  
  iVar2 = Vec_IntSize(vPivot);
  if (iVar2 < 2) {
    p_local._4_4_ = 0;
  }
  else {
    for (Lit = 1; iVar2 = Vec_IntSize(vPivot), Lit < iVar2; Lit = Lit + 1) {
      iVar2 = Vec_IntEntry(vPivot,Lit);
      Lit2 = Lit;
      while( true ) {
        Lit2 = Lit2 + 1;
        iVar4 = Vec_IntSize(vPivot);
        if (iVar4 <= Lit2) break;
        iVar4 = Vec_IntEntry(vPivot,Lit2);
        if (iVar4 <= iVar2) {
          __assert_fail("Lit < Lit2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                        ,0x317,"int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)"
                       );
        }
        Vec_IntClear(p->vCubeFree);
        pVVar1 = p->vCubeFree;
        iVar3 = Abc_LitNot(iVar2);
        iVar3 = Abc_Var2Lit(iVar3,0);
        Vec_IntPush(pVVar1,iVar3);
        pVVar1 = p->vCubeFree;
        iVar4 = Abc_LitNot(iVar4);
        iVar4 = Abc_Var2Lit(iVar4,1);
        Vec_IntPush(pVVar1,iVar4);
        iVar4 = Hsh_VecManAdd(p->pHash,p->vCubeFree);
        if (fRemove == 0) {
          iVar3 = Vec_FltSize(p->vWeights);
          if (iVar3 == iVar4) {
            p_00 = p->vWeights;
            iVar3 = Fx_ManComputeLevelDiv(p,p->vCubeFree);
            Vec_FltPush(p_00,(float)iVar3 * -0.001 + -1.1);
            p->nDivsS = p->nDivsS + 1;
          }
          iVar3 = Vec_FltSize(p->vWeights);
          if (iVar3 <= iVar4) {
            __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                          ,0x323,
                          "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)");
          }
          Vec_FltAddToEntry(p->vWeights,iVar4,1.0);
          p->nPairsS = p->nPairsS + 1;
        }
        else {
          iVar3 = Vec_FltSize(p->vWeights);
          if (iVar3 <= iVar4) {
            __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                          ,0x329,
                          "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)");
          }
          Vec_FltAddToEntry(p->vWeights,iVar4,-1.0);
          p->nPairsS = p->nPairsS + -1;
        }
        if (fUpdate != 0) {
          iVar3 = Vec_QueIsMember(p->vPrio,iVar4);
          if (iVar3 == 0) {
            if (fRemove == 0) {
              Vec_QuePush(p->vPrio,iVar4);
            }
          }
          else {
            Vec_QueUpdate(p->vPrio,iVar4);
          }
        }
      }
    }
    iVar2 = Vec_IntSize(vPivot);
    iVar4 = Vec_IntSize(vPivot);
    p_local._4_4_ = (iVar2 * (iVar4 + -1)) / 2;
  }
  return p_local._4_4_;
}

Assistant:

int Fx_ManCubeSingleCubeDivisors( Fx_Man_t * p, Vec_Int_t * vPivot, int fRemove, int fUpdate )
{
    int k, n, Lit, Lit2, iDiv;
    if ( Vec_IntSize(vPivot) < 2 )
        return 0;
    Vec_IntForEachEntryStart( vPivot, Lit, k, 1 )
    Vec_IntForEachEntryStart( vPivot, Lit2, n, k+1 )
    {
        assert( Lit < Lit2 );
        Vec_IntClear( p->vCubeFree );
        Vec_IntPush( p->vCubeFree, Abc_Var2Lit(Abc_LitNot(Lit), 0) );
        Vec_IntPush( p->vCubeFree, Abc_Var2Lit(Abc_LitNot(Lit2), 1) );
        iDiv = Hsh_VecManAdd( p->pHash, p->vCubeFree );
        if ( !fRemove )
        {
            if ( Vec_FltSize(p->vWeights) == iDiv )
            {
                Vec_FltPush(p->vWeights, -2 + 0.9 - 0.001 * Fx_ManComputeLevelDiv(p, p->vCubeFree));
                p->nDivsS++;
            }
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, 1 );
            p->nPairsS++;
        }
        else
        {
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, -1 );
            p->nPairsS--;
        }
        if ( fUpdate )
        {
            if ( Vec_QueIsMember(p->vPrio, iDiv) )
                Vec_QueUpdate( p->vPrio, iDiv );
            else if ( !fRemove )
                Vec_QuePush( p->vPrio, iDiv );
        }
    }
    return Vec_IntSize(vPivot) * (Vec_IntSize(vPivot) - 1) / 2;
}